

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_idict_get_flag(stb_idict *a,stb_int32 k,stb_int32 *v)

{
  stb__stb_idict__hashpair *psVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  stb_int32 *psVar7;
  ulong uVar8;
  ulong uVar6;
  
  if (k == 3) {
    bVar2 = a->has_del;
    if (bVar2 == 0) goto LAB_001855b6;
    psVar7 = &a->dv;
  }
  else if (k == 1) {
    bVar2 = a->has_empty;
    if (bVar2 == 0) goto LAB_001855b6;
    psVar7 = &a->ev;
  }
  else {
    iVar3 = ((uint)k >> 0x13) + ((uint)k >> 6) + k;
    uVar4 = iVar3 * 0x80008 ^ iVar3 * 0x10001;
    uVar4 = (uVar4 >> 5) + uVar4;
    uVar4 = uVar4 * 4 ^ uVar4;
    uVar4 = (uVar4 >> 0xf) + uVar4;
    uVar4 = uVar4 * 0x400 ^ uVar4;
    uVar4 = (uVar4 >> 0x13) + (uVar4 >> 6) + uVar4;
    uVar5 = a->mask & uVar4;
    uVar6 = (ulong)uVar5;
    psVar1 = a->table;
    uVar8 = (ulong)uVar5;
    if (psVar1[uVar8].k == 1) {
LAB_0018556e:
      bVar2 = 0;
      goto LAB_001855b6;
    }
    if (psVar1[uVar8].k != k) {
      do {
        uVar6 = (ulong)((int)uVar6 + ((uVar4 >> 0x13) + (uVar4 >> 6) + uVar4 | 1) & a->mask);
        if (psVar1[uVar6].k == 1) goto LAB_0018556e;
        uVar8 = uVar6;
      } while (psVar1[uVar6].k != k);
    }
    psVar7 = &psVar1[uVar8].v;
    bVar2 = 1;
  }
  *v = *psVar7;
LAB_001855b6:
  return (int)bVar2;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}